

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplex.h
# Opt level: O1

ostream * Gudhi::skeleton_blocker::operator<<
                    (ostream *o,
                    Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                    *sigma)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  _Rb_tree_header *p_Var4;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"{",1);
  p_Var2 = (sigma->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(sigma->simplex_set)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    bVar3 = true;
    do {
      _Var1 = p_Var2[1]._M_color;
      if (bVar3) {
        bVar3 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(o,",",1);
      }
      std::ostream::operator<<((ostream *)o,_Var1);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"}",1);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o,
                                  const Skeleton_blocker_simplex & sigma) {
    bool first = true;
    o << "{";
    for (auto i : sigma) {
      if (first)
        first = false;
      else
        o << ",";
      o << i;
    }
    o << "}";
    return o;
  }